

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::EnsureStackFunctionListStackSym(Lowerer *this)

{
  int iVar1;
  Func *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackSym *stackSym;
  SymOpnd *pSVar5;
  
  this_00 = this->m_func;
  if (this_00->hasAnyStackNestedFunc == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1a28,"(func->HasAnyStackNestedFunc())","func->HasAnyStackNestedFunc()");
    if (!bVar3) goto LAB_0058f0f2;
    *puVar4 = 0;
  }
  iVar1 = this_00->m_localStackHeight;
  bVar3 = Func::HasArgumentSlot(this_00);
  if (iVar1 != (uint)bVar3 << 3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1a2a,
                       "(func->m_localStackHeight == (func->HasArgumentSlot()? MachArgsSlotOffset : 0))"
                       ,
                       "func->m_localStackHeight == (func->HasArgumentSlot()? MachArgsSlotOffset : 0)"
                      );
    if (!bVar3) {
LAB_0058f0f2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  stackSym = StackSym::New(TyUint64,this_00);
  Func::StackAllocate(this_00,stackSym,8);
  pSVar5 = IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,this_00);
  this->nextStackFunctionOpnd = &pSVar5->super_Opnd;
  return;
}

Assistant:

void
Lowerer::EnsureStackFunctionListStackSym()
{
    Func * func = this->m_func;
    Assert(func->HasAnyStackNestedFunc());
#if defined(_M_IX86) || defined(_M_X64)
    Assert(func->m_localStackHeight == (func->HasArgumentSlot()? MachArgsSlotOffset : 0));
    StackSym * stackFunctionListStackSym = StackSym::New(TyMachPtr, func);
    func->StackAllocate(stackFunctionListStackSym, sizeof(Js::ScriptFunction *));
    nextStackFunctionOpnd = IR::SymOpnd::New(stackFunctionListStackSym, TyMachPtr, func);
#else
    Assert(func->m_localStackHeight == 0);
    nextStackFunctionOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(NULL, FRAME_REG, TyMachReg, func),
        -(int32)(Js::Constants::StackNestedFuncList * sizeof(Js::Var)), TyMachPtr, func);
#endif
}